

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

void __thiscall
dynet::SimpleRNNBuilder::SimpleRNNBuilder
          (SimpleRNNBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model,bool support_lags)

{
  Parameter PVar1;
  Parameter PVar2;
  bool bVar3;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<dynet::Parameter> __l;
  initializer_list<unsigned_int> x_02;
  allocator local_141;
  ParameterCollection *local_140;
  Parameter local_138;
  uint local_12c;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  uint local_110;
  uint local_10c;
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  *local_108;
  string local_100;
  pointer local_e0;
  ParameterStorage *local_d8;
  ParameterCollection local_d0;
  
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__SimpleRNNBuilder_00710110;
  local_108 = &this->params;
  local_140 = &this->local_model;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParameterCollection::ParameterCollection(local_140);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->layers = layers;
  this->lagging = support_lags;
  std::__cxx11::string::string((string *)&local_100,"simple-rnn-builder",(allocator *)&ps);
  ParameterCollection::add_subcollection(&local_d0,model,&local_100);
  ParameterCollection::operator=(local_140,&local_d0);
  ParameterCollection::~ParameterCollection(&local_d0);
  std::__cxx11::string::~string((string *)&local_100);
  local_e0 = (pointer)&PTR__ParameterInit_0070fae0;
  local_12c = hidden_dim;
  while (bVar3 = layers != 0, layers = layers - 1, bVar3) {
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
    x._M_len = 2;
    x._M_array = (iterator)&ps;
    Dim::Dim((Dim *)&local_d0,x);
    std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_138);
    local_d8 = (ParameterStorage *)
               ParameterCollection::add_parameters
                         (local_140,(Dim *)&local_d0,0.0,&local_100,dynet::default_device);
    std::__cxx11::string::~string((string *)&local_100);
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_00._M_len = 2;
    x_00._M_array = (iterator)&ps;
    Dim::Dim((Dim *)&local_d0,x_00);
    std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_138);
    PVar1 = ParameterCollection::add_parameters
                      (local_140,(Dim *)&local_d0,0.0,&local_100,dynet::default_device);
    std::__cxx11::string::~string((string *)&local_100);
    local_138.p._0_4_ = local_12c;
    x_01._M_len = 1;
    x_01._M_array = (iterator)&local_138;
    Dim::Dim((Dim *)&local_d0,x_01);
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_start = local_e0;
    ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_110);
    PVar2 = ParameterCollection::add_parameters
                      (local_140,(Dim *)&local_d0,(ParameterInit *)&ps,&local_100,
                       dynet::default_device);
    std::__cxx11::string::~string((string *)&local_100);
    local_d0.name._M_dataplus._M_p = (pointer)local_d8;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_d0;
    local_d0.name._M_string_length = (size_type)PVar1;
    local_d0.name.field_2._M_allocated_capacity = (size_type)PVar2;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (&ps,__l,(allocator_type *)&local_100);
    hidden_dim = local_12c;
    if (this->lagging == true) {
      local_110 = local_12c;
      local_10c = local_12c;
      x_02._M_len = 2;
      x_02._M_array = &local_110;
      Dim::Dim((Dim *)&local_d0,x_02);
      std::__cxx11::string::string((string *)&local_100,"",&local_141);
      local_138 = ParameterCollection::add_parameters
                            (local_140,(Dim *)&local_d0,0.0,&local_100,dynet::default_device);
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::
      emplace_back<dynet::Parameter>(&ps,&local_138);
      std::__cxx11::string::~string((string *)&local_100);
    }
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back(local_108,
                (value_type *)
                &ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>);
    std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
              (&ps.super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>);
    input_dim = hidden_dim;
  }
  (this->super_RNNBuilder).dropout_rate = 0.0;
  return;
}

Assistant:

SimpleRNNBuilder::SimpleRNNBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model,
                       bool support_lags) : layers(layers), lagging(support_lags) {
  local_model = model.add_subcollection("simple-rnn-builder");
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_hb = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    vector<Parameter> ps = {p_x2h, p_h2h, p_hb};
    if (lagging)
        ps.push_back(local_model.add_parameters({hidden_dim, hidden_dim}));
    params.push_back(ps);
    layer_input_dim = hidden_dim;
  }
  dropout_rate = 0.f;
}